

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet6_address.cpp
# Opt level: O2

result<in6_addr> *
sockpp::inet6_address::resolve_name(result<in6_addr> *__return_storage_ptr__,string *saddr)

{
  sockaddr *psVar1;
  int iVar2;
  gai_errc e;
  error_code eVar3;
  addrinfo *res;
  in6_addr addr;
  in6_addr ia;
  addrinfo hints;
  
  iVar2 = inet_pton(10,(saddr->_M_dataplus)._M_p,&ia);
  if (iVar2 != 1) {
    hints.ai_flags = 0;
    hints.ai_protocol = 0;
    hints.ai_canonname = (char *)0x0;
    hints.ai_next = (addrinfo *)0x0;
    hints.ai_addrlen = 0;
    hints._20_4_ = 0;
    hints.ai_addr = (sockaddr *)0x0;
    hints.ai_family = 10;
    hints.ai_socktype = 1;
    e = getaddrinfo((saddr->_M_dataplus)._M_p,(char *)0x0,(addrinfo *)&hints,(addrinfo **)&res);
    if (e != ~invalid_argument) {
      if (e == system_error) {
        eVar3 = result<sockpp::none>::last_error();
      }
      else {
        eVar3 = make_error_code(e);
      }
      *(undefined8 *)&(__return_storage_ptr__->val_).__in6_u = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->val_).__in6_u + 8) = 0;
      (__return_storage_ptr__->err_)._M_value = eVar3._M_value;
      (__return_storage_ptr__->err_)._M_cat = eVar3._M_cat;
      return __return_storage_ptr__;
    }
    psVar1 = res->ai_addr;
    addr.__in6_u._0_8_ = *(undefined8 *)(psVar1->sa_data + 6);
    addr.__in6_u._8_2_ = psVar1[1].sa_family;
    addr.__in6_u._10_1_ = psVar1[1].sa_data[0];
    addr.__in6_u._11_1_ = psVar1[1].sa_data[1];
    addr.__in6_u._12_1_ = psVar1[1].sa_data[2];
    addr.__in6_u._13_1_ = psVar1[1].sa_data[3];
    addr.__in6_u._14_1_ = psVar1[1].sa_data[4];
    addr.__in6_u._15_1_ = psVar1[1].sa_data[5];
    freeaddrinfo((addrinfo *)res);
    ia.__in6_u.__u6_addr32[0] = addr.__in6_u.__u6_addr32[0];
    ia.__in6_u.__u6_addr32[1] = addr.__in6_u.__u6_addr32[1];
    ia.__in6_u.__u6_addr32[2] = addr.__in6_u.__u6_addr32[2];
    ia.__in6_u.__u6_addr32[3] = addr.__in6_u.__u6_addr32[3];
  }
  (__return_storage_ptr__->val_).__in6_u.__u6_addr32[0] = ia.__in6_u.__u6_addr32[0];
  (__return_storage_ptr__->val_).__in6_u.__u6_addr32[1] = ia.__in6_u.__u6_addr32[1];
  (__return_storage_ptr__->val_).__in6_u.__u6_addr32[2] = ia.__in6_u.__u6_addr32[2];
  (__return_storage_ptr__->val_).__in6_u.__u6_addr32[3] = ia.__in6_u.__u6_addr32[3];
  std::error_code::error_code(&__return_storage_ptr__->err_);
  return __return_storage_ptr__;
}

Assistant:

result<in6_addr> inet6_address::resolve_name(const string& saddr) noexcept {
#if !defined(_WIN32)
    in6_addr ia;
    if (::inet_pton(ADDRESS_FAMILY, saddr.c_str(), &ia) == 1)
        return ia;
#endif

    addrinfo *res, hints = addrinfo{};
    hints.ai_family = ADDRESS_FAMILY;
    hints.ai_socktype = SOCK_STREAM;

    int err = ::getaddrinfo(saddr.c_str(), NULL, &hints, &res);

    if (err != 0) {
        error_code ec{};
#if defined(_WIN32)
        ec = error_code{errno, system_category()};
#else
        if (err == EAI_SYSTEM)
            ec = result<>::last_error();
        else
            ec = make_error_code(static_cast<gai_errc>(err));
#endif
        return ec;
    }

    auto ipv6 = reinterpret_cast<sockaddr_in6*>(res->ai_addr);
    auto addr = ipv6->sin6_addr;
    freeaddrinfo(res);
    return addr;
}